

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O3

_Bool multiply_monster(monster *mon)

{
  loc grid_00;
  monster_group_info group_info;
  _Bool _Var1;
  wchar_t wVar2;
  monster_conflict *mon_00;
  loc_conflict grid;
  monster_group_info info;
  loc local_40;
  undefined8 local_38;
  player_race *ppStack_30;
  
  local_38 = 0;
  ppStack_30 = (player_race *)0x0;
  _Var1 = monster_is_shape_unique(mon);
  if ((_Var1) ||
     (grid_00.x = (mon->grid).x, grid_00.y = (mon->grid).y,
     wVar2 = scatter_ext(cave,&local_40,L'\x01',grid_00,L'\x01',true,square_isempty),
     wVar2 < L'\x01')) {
    return false;
  }
  group_info.player_race = ppStack_30;
  group_info.index = (undefined4)local_38;
  group_info.role = local_38._4_4_;
  _Var1 = place_new_monster((chunk *)cave,local_40,mon->race,false,false,group_info,'\x14');
  if (!_Var1) {
    return false;
  }
  mon_00 = (monster_conflict *)square_monster(cave,local_40);
  if (mon_00 == (monster_conflict *)0x0) {
    return true;
  }
  _Var1 = monster_is_camouflaged((monster *)mon_00);
  if (!_Var1) {
    return true;
  }
  _Var1 = monster_is_camouflaged(mon);
  if (_Var1) {
    return true;
  }
  become_aware((chunk *)cave,mon_00);
  return true;
}

Assistant:

bool multiply_monster(const struct monster *mon)
{
	struct loc grid;
	bool result;
	struct monster_group_info info = { 0, 0, 0 };

	/*
	 * Pick an empty location except for uniques:  they can never
	 * multiply (need a check here as the ones in place_new_monster()
	 * are not sufficient for a unique shape of a shapechanged monster
	 * since it may have zero for cur_num in the race structure for the
	 * shape).
	 */
	if (!monster_is_shape_unique(mon) && scatter_ext(cave, &grid,
			1, mon->grid, 1, true, square_isempty) > 0) {
		/* Create a new monster (awake, no groups) */
		result = place_new_monster(cave, grid, mon->race, false, false,
			info, ORIGIN_DROP_BREED);
		/*
		 * Fix so multiplying a revealed camouflaged monster creates
		 * another revealed camouflaged monster.
		 */
		if (result) {
			struct monster *child = square_monster(cave, grid);

			if (child && monster_is_camouflaged(child)
					&& !monster_is_camouflaged(mon)) {
				become_aware(cave, child);
			}
		}
	} else {
		result = false;
	}

	/* Result */
	return (result);
}